

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.hpp
# Opt level: O1

void __thiscall
pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>::transaction
          (transaction<pstore::lock_guard<pstore::transaction_mutex>_> *this,database *db,
          lock_type *lock)

{
  transaction_base::transaction_base(&this->super_transaction_base,db);
  (this->super_transaction_base)._vptr_transaction_base = (_func_int **)&PTR__transaction_00132f68;
  pstore::file::range_lock::range_lock((range_lock *)&this->lock_,(range_lock *)lock);
  (this->lock_).owned_ = lock->owned_;
  lock->owned_ = false;
  if ((this->super_transaction_base).first_.a_ == 0) {
    return;
  }
  assert_failed("!this->is_open ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/transaction.hpp"
                ,0xd7);
}

Assistant:

transaction<LockGuard>::transaction (database & db, LockGuard && lock)
            : transaction_base (db)
            , lock_{std::move (lock)} {

        PSTORE_ASSERT (!this->is_open ());
    }